

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void reportBadObjLib(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *badObjLib,
                    cmGeneratorTarget *target,cmake *cm)

{
  ostream *poVar1;
  cmSourceFileLocation *pcVar2;
  pointer ppcVar3;
  string local_208;
  cmListFileBacktrace local_1e8;
  ostringstream e;
  
  if ((badObjLib->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
      super__Vector_impl_data._M_start !=
      (badObjLib->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar1 = std::operator<<((ostream *)&e,"OBJECT library \"");
    poVar1 = std::operator<<(poVar1,(string *)&target->Target->Name);
    std::operator<<(poVar1,"\" contains:\n");
    for (ppcVar3 = (badObjLib->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        ppcVar3 !=
        (badObjLib->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppcVar3 = ppcVar3 + 1) {
      poVar1 = std::operator<<((ostream *)&e,"  ");
      pcVar2 = cmSourceFile::GetLocation(*ppcVar3);
      poVar1 = std::operator<<(poVar1,(string *)&pcVar2->Name);
      std::operator<<(poVar1,"\n");
    }
    std::operator<<((ostream *)&e,
                    "but may contain only sources that compile, header files, and other files that would not affect linking of a normal library."
                   );
    std::__cxx11::stringbuf::str();
    cmGeneratorTarget::GetBacktrace(&local_1e8,target);
    cmake::IssueMessage(cm,FATAL_ERROR,&local_208,&local_1e8,false);
    cmListFileBacktrace::~cmListFileBacktrace(&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  return;
}

Assistant:

void reportBadObjLib(std::vector<cmSourceFile*> const& badObjLib,
                     cmGeneratorTarget const* target, cmake *cm)
{
  if(!badObjLib.empty())
    {
    std::ostringstream e;
    e << "OBJECT library \"" << target->GetName() << "\" contains:\n";
    for(std::vector<cmSourceFile*>::const_iterator i = badObjLib.begin();
        i != badObjLib.end(); ++i)
      {
      e << "  " << (*i)->GetLocation().GetName() << "\n";
      }
    e << "but may contain only sources that compile, header files, and "
         "other files that would not affect linking of a normal library.";
    cm->IssueMessage(cmake::FATAL_ERROR, e.str(),
                     target->GetBacktrace());
    }
}